

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TRef rec_upvalue(jit_State *J,uint32_t uv,TRef val)

{
  char cVar1;
  lua_State *plVar2;
  ushort uVar3;
  TRef TVar4;
  int iVar5;
  TRef TVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int32_t slot;
  cTValue *o;
  long lVar10;
  IRRef1 IVar11;
  uint uVar12;
  
  lVar10 = *(long *)((long)J->fn + (ulong)uv * 8 + 0x28);
  TVar4 = getcurrf(J);
  IVar11 = (IRRef1)TVar4;
  if (*(char *)(lVar10 + 0xb) != '\0') {
    o = *(cTValue **)(lVar10 + 0x20);
    lVar8 = o->it64 >> 0x2f;
    if ((1 < lVar8 + 0xdU) && (lVar8 != -7)) {
      if (lVar8 == -0xb) {
        uVar7 = o->it64 & 0x7fffffffffff;
        if ((*(byte *)(uVar7 + 8) & 0x90) != 0) goto LAB_0012f1f3;
        lVar8 = **(long **)&J[-1].penalty[0x3c].val;
        lVar9 = (ulong)*(ushort *)(uVar7 + 10) * 0x18;
        if ((*(uint *)(lVar8 + lVar9) < 0x60000000) && (0x10 < *(uint *)(lVar8 + lVar9 + 4)))
        goto LAB_0012f1f3;
      }
      if ((short)IVar11 < 0) {
        if (0x5f < J->pt->flags) goto LAB_0012f1f3;
        TVar4 = lj_ir_kgc(J,(GCobj *)J->fn,IRT_FUNC);
        (J->fold).ins.field_0.ot = 0x888;
        (J->fold).ins.field_0.op1 = IVar11;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
        lj_opt_fold(J);
        J->base[-2] = TVar4;
        o = *(cTValue **)(lVar10 + 0x20);
      }
      IVar11 = (IRRef1)TVar4;
      TVar4 = lj_record_constify(J,o);
      if (TVar4 != 0) {
        return TVar4;
      }
    }
  }
LAB_0012f1f3:
  uVar12 = *(uint *)(lVar10 + 0x28) + 0xfb3ee249;
  iVar5 = (*(uint *)(lVar10 + 0x28) ^ uVar12) - (uVar12 * 0x4000 | uVar12 >> 0x12);
  uVar3 = ((ushort)(uVar12 >> 0xd) ^ (ushort)iVar5) - (ushort)((uint)iVar5 >> 0x13) & 0xff |
          (ushort)(uv << 8);
  cVar1 = *(char *)(lVar10 + 10);
  if (cVar1 == '\0') {
    (J->fold).ins.field_0.ot = 0x3c89;
    (J->fold).ins.field_0.op1 = IVar11;
    (J->fold).ins.field_0.op2 = uVar3;
    TVar4 = lj_opt_fold(J);
    uVar7 = *(ulong *)(lVar10 + 0x20);
    plVar2 = J->L;
    IVar11 = (IRRef1)TVar4;
    if ((((plVar2->stack).ptr64 <= uVar7) && (uVar7 < (plVar2->maxstack).ptr64)) &&
       (iVar5 = (int)(uVar7 - (long)(plVar2->base + -J->baseslot) >> 3), -1 < iVar5)) {
      TVar4 = lj_ir_kint(J,iVar5 * -8 + 0x10);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = IVar11;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar4 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x889;
      (J->fold).ins.field_0.op1 = 0x8000;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      lj_opt_fold(J);
      lVar10 = (long)iVar5 - (long)(int)J->baseslot;
      slot = (int32_t)lVar10;
      if (val == 0) {
        TVar4 = J->base[lVar10];
        if (TVar4 != 0) {
          return TVar4;
        }
        TVar4 = sload(J,slot);
        return TVar4;
      }
      J->base[lVar10] = val;
      if (slot < (int)J->maxslot) {
        return 0;
      }
      J->maxslot = slot + 1;
      return 0;
    }
    (J->fold).ins.field_0.op1 = IVar11;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x2a098000;
    TVar4 = lj_opt_fold(J);
    TVar6 = lj_ir_kint(J,(J->maxslot + J->baseslot) * 8);
    (J->fold).ins.field_0.ot = 0x789;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
    lj_opt_fold(J);
  }
  else {
    (J->fold).ins.field_0.ot = 0x3d89;
    (J->fold).ins.field_0.op1 = IVar11;
    (J->fold).ins.field_0.op2 = uVar3;
    TVar4 = lj_opt_fold(J);
    IVar11 = (IRRef1)TVar4;
  }
  if (val == 0) {
    uVar12 = 0xe;
    if (0xfffffffffffffff1 < (ulong)(**(long **)(lVar10 + 0x20) >> 0x2f)) {
      uVar12 = ~(uint)(**(long **)(lVar10 + 0x20) >> 0x2f);
    }
    (J->fold).ins.field_0.ot = (ushort)uVar12 | 0x4480;
    (J->fold).ins.field_0.op1 = IVar11;
    (J->fold).ins.field_0.op2 = 0;
    TVar6 = lj_opt_fold(J);
    TVar4 = uVar12 * 0x1000001 ^ 0x7fff;
    if (2 < uVar12) {
      TVar4 = TVar6;
    }
  }
  else {
    uVar12 = val >> 0x18 & 0x1f;
    if (uVar12 - 0xf < 5) {
      (J->fold).ins.field_0.op1 = (IRRef1)val;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
      val = lj_opt_fold(J);
      uVar12 = val >> 0x18 & 0x1f;
    }
    (J->fold).ins.field_0.ot = (short)uVar12 + 0x4c00;
    (J->fold).ins.field_0.op1 = IVar11;
    (J->fold).ins.field_0.op2 = (IRRef1)val;
    lj_opt_fold(J);
    if ((cVar1 != '\0') && (uVar12 - 4 < 9)) {
      (J->fold).ins.field_0.ot = 0x5900;
      (J->fold).ins.field_0.op1 = IVar11;
      (J->fold).ins.field_0.op2 = (IRRef1)val;
      lj_opt_fold(J);
    }
    J->needsnap = '\x01';
    TVar4 = 0;
  }
  return TVar4;
}

Assistant:

static TRef rec_upvalue(jit_State *J, uint32_t uv, TRef val)
{
  GCupval *uvp = &gcref(J->fn->l.uvptr[uv])->uv;
  TRef fn = getcurrf(J);
  IRRef uref;
  int needbarrier = 0;
  if (rec_upvalue_constify(J, uvp)) {  /* Try to constify immutable upvalue. */
    TRef tr, kfunc;
    lj_assertJ(val == 0, "bad usage");
    if (!tref_isk(fn)) {  /* Late specialization of current function. */
      if (J->pt->flags >= PROTO_CLC_POLY)
	goto noconstify;
      kfunc = lj_ir_kfunc(J, J->fn);
      emitir(IRTG(IR_EQ, IRT_FUNC), fn, kfunc);
#if LJ_FR2
      J->base[-2] = kfunc;
#else
      J->base[-1] = kfunc | TREF_FRAME;
#endif
      fn = kfunc;
    }
    tr = lj_record_constify(J, uvval(uvp));
    if (tr)
      return tr;
  }
noconstify:
  /* Note: this effectively limits LJ_MAX_UPVAL to 127. */
  uv = (uv << 8) | (hashrot(uvp->dhash, uvp->dhash + HASH_BIAS) & 0xff);
  if (!uvp->closed) {
    uref = tref_ref(emitir(IRTG(IR_UREFO, IRT_PGC), fn, uv));
    /* In current stack? */
    if (uvval(uvp) >= tvref(J->L->stack) &&
	uvval(uvp) < tvref(J->L->maxstack)) {
      int32_t slot = (int32_t)(uvval(uvp) - (J->L->base - J->baseslot));
      if (slot >= 0) {  /* Aliases an SSA slot? */
	emitir(IRTG(IR_EQ, IRT_PGC),
	       REF_BASE,
	       emitir(IRT(IR_ADD, IRT_PGC), uref,
		      lj_ir_kint(J, (slot - 1 - LJ_FR2) * -8)));
	slot -= (int32_t)J->baseslot;  /* Note: slot number may be negative! */
	if (val == 0) {
	  return getslot(J, slot);
	} else {
	  J->base[slot] = val;
	  if (slot >= (int32_t)J->maxslot) J->maxslot = (BCReg)(slot+1);
	  return 0;
	}
      }
    }
    emitir(IRTG(IR_UGT, IRT_PGC),
	   emitir(IRT(IR_SUB, IRT_PGC), uref, REF_BASE),
	   lj_ir_kint(J, (J->baseslot + J->maxslot) * 8));
  } else {
    needbarrier = 1;
    uref = tref_ref(emitir(IRTG(IR_UREFC, IRT_PGC), fn, uv));
  }
  if (val == 0) {  /* Upvalue load */
    IRType t = itype2irt(uvval(uvp));
    TRef res = emitir(IRTG(IR_ULOAD, t), uref, 0);
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitive refs. */
    return res;
  } else {  /* Upvalue store. */
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(val))
      val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
    emitir(IRT(IR_USTORE, tref_type(val)), uref, val);
    if (needbarrier && tref_isgcv(val))
      emitir(IRT(IR_OBAR, IRT_NIL), uref, val);
    J->needsnap = 1;
    return 0;
  }
}